

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O2

void skipblock(int level,char start,char end)

{
  bool bVar1;
  char cVar2;
  
  do {
    while( true ) {
      cVar2 = getchr();
      if (cVar2 == '\0') {
        return;
      }
      if (cVar2 != start) break;
      level = level + 1;
    }
  } while ((cVar2 != end) || (bVar1 = 1 < level, level = level + -1, bVar1));
  return;
}

Assistant:

void skipblock(int level,char start,char end)
/* skips a block between the two specified start- and end-characters */
{
  char c;

  while (c = getchr()) {
    if (c == start) {
      ++level;
    }
    else if (c == end) {
      if (--level <= 0)
        break;
    }
  }
}